

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void google::protobuf::compiler::cpp::anon_unknown_0::CollectMapInfo
               (Options *options,Descriptor *descriptor,
               flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  Descriptor *pDVar1;
  bool bVar2;
  CppType CVar3;
  Type TVar4;
  LogMessage *pLVar5;
  MappedReference<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar6;
  cpp *this;
  char *pcVar7;
  CppType in_ECX;
  AlphaNum *this_00;
  string_view s;
  string_view s_00;
  basic_string_view<char,_std::char_traits<char>_> local_2f8;
  string local_2e8;
  AlphaNum local_2c8;
  AlphaNum local_298;
  undefined1 local_268 [32];
  basic_string_view<char,_std::char_traits<char>_> local_248;
  string local_238;
  AlphaNum local_218;
  AlphaNum local_1e8;
  undefined1 local_1b8 [64];
  string local_178;
  AlphaNum local_158;
  string_view local_128;
  AlphaNum local_118;
  AlphaNum local_e8;
  undefined1 local_b8 [64];
  FieldDescriptor *local_78;
  FieldDescriptor *val;
  FieldDescriptor *key;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  byte local_49;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  LogMessageFatal local_38 [23];
  Voidify local_21;
  FieldDescriptor *local_20;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  Descriptor *descriptor_local;
  Options *options_local;
  
  local_20 = (FieldDescriptor *)variables;
  variables_local =
       (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)descriptor;
  descriptor_local = (Descriptor *)options;
  bVar2 = IsMapEntryMessage(descriptor);
  local_49 = 0;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"IsMapEntryMessage(descriptor)");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
               ,0x112,local_48._M_len,local_48._M_str);
    in_ECX = (CppType)local_48._M_len;
    local_49 = 1;
    pLVar5 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar5);
  }
  if ((local_49 & 1) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  key = local_20;
  val = (FieldDescriptor *)google::protobuf::Descriptor::map_key();
  local_78 = (FieldDescriptor *)google::protobuf::Descriptor::map_value();
  pDVar1 = descriptor_local;
  CVar3 = FieldDescriptor::cpp_type(val);
  PrimitiveTypeName_abi_cxx11_
            ((string *)(local_b8 + 0x20),(cpp *)pDVar1,(Options *)(ulong)CVar3,in_ECX);
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[8],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)key,(key_arg<char[8]> *)"key_cpp");
  std::__cxx11::string::operator=((string *)pbVar6,(string *)(local_b8 + 0x20));
  std::__cxx11::string::~string((string *)(local_b8 + 0x20));
  CVar3 = FieldDescriptor::cpp_type(local_78);
  pDVar1 = descriptor_local;
  this_00 = (AlphaNum *)(ulong)CVar3;
  if (CVar3 == CPPTYPE_ENUM) {
    this = (cpp *)google::protobuf::FieldDescriptor::enum_type();
    ClassName_abi_cxx11_(&local_178,this,(EnumDescriptor *)0x1,SUB81(this_00,0));
    pbVar6 = absl::lts_20240722::container_internal::
             raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[8],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)key,(key_arg<char[8]> *)"val_cpp");
    std::__cxx11::string::operator=((string *)pbVar6,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
  }
  else if (CVar3 == CPPTYPE_MESSAGE) {
    absl::lts_20240722::AlphaNum::AlphaNum(&local_e8,"::");
    local_128 = ProtobufNamespace((Options *)descriptor_local);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_118,local_128);
    this_00 = &local_158;
    absl::lts_20240722::AlphaNum::AlphaNum(this_00,"::Message");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_b8,&local_e8,&local_118);
    pbVar6 = absl::lts_20240722::container_internal::
             raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[8],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)key,(key_arg<char[8]> *)"val_cpp");
    std::__cxx11::string::operator=((string *)pbVar6,(string *)local_b8);
    std::__cxx11::string::~string((string *)local_b8);
  }
  else {
    CVar3 = FieldDescriptor::cpp_type(local_78);
    PrimitiveTypeName_abi_cxx11_
              ((string *)(local_1b8 + 0x20),(cpp *)pDVar1,(Options *)(ulong)CVar3,(CppType)this_00);
    pbVar6 = absl::lts_20240722::container_internal::
             raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[8],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)key,(key_arg<char[8]> *)"val_cpp");
    std::__cxx11::string::operator=((string *)pbVar6,(string *)(local_1b8 + 0x20));
    std::__cxx11::string::~string((string *)(local_1b8 + 0x20));
  }
  absl::lts_20240722::AlphaNum::AlphaNum(&local_1e8,"TYPE_");
  TVar4 = FieldDescriptor::type(val);
  pcVar7 = DeclaredTypeMethodName(TVar4);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_248,pcVar7);
  s._M_str = (char *)this_00;
  s._M_len = (size_t)local_248._M_str;
  absl::lts_20240722::AsciiStrToUpper_abi_cxx11_(&local_238,(lts_20240722 *)local_248._M_len,s);
  absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_218,&local_238);
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_1b8,&local_1e8);
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[14],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)key,(key_arg<char[14]> *)"key_wire_type");
  std::__cxx11::string::operator=((string *)pbVar6,(string *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)&local_238);
  absl::lts_20240722::AlphaNum::AlphaNum(&local_298,"TYPE_");
  TVar4 = FieldDescriptor::type(local_78);
  pcVar7 = DeclaredTypeMethodName(TVar4);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2f8,pcVar7);
  s_00._M_str = (char *)this_00;
  s_00._M_len = (size_t)local_2f8._M_str;
  absl::lts_20240722::AsciiStrToUpper_abi_cxx11_(&local_2e8,(lts_20240722 *)local_2f8._M_len,s_00);
  absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_2c8,&local_2e8);
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_268,&local_298);
  pbVar6 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[14],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)key,(key_arg<char[14]> *)"val_wire_type");
  std::__cxx11::string::operator=((string *)pbVar6,(string *)local_268);
  std::__cxx11::string::~string((string *)local_268);
  std::__cxx11::string::~string((string *)&local_2e8);
  return;
}

Assistant:

void CollectMapInfo(
    const Options& options, const Descriptor* descriptor,
    absl::flat_hash_map<absl::string_view, std::string>* variables) {
  ABSL_CHECK(IsMapEntryMessage(descriptor));
  absl::flat_hash_map<absl::string_view, std::string>& vars = *variables;
  const FieldDescriptor* key = descriptor->map_key();
  const FieldDescriptor* val = descriptor->map_value();
  vars["key_cpp"] = PrimitiveTypeName(options, key->cpp_type());
  switch (val->cpp_type()) {
    case FieldDescriptor::CPPTYPE_MESSAGE:
      vars["val_cpp"] =
          absl::StrCat("::", ProtobufNamespace(options), "::Message");
      break;
    case FieldDescriptor::CPPTYPE_ENUM:
      vars["val_cpp"] = ClassName(val->enum_type(), true);
      break;
    default:
      vars["val_cpp"] = PrimitiveTypeName(options, val->cpp_type());
  }
  vars["key_wire_type"] = absl::StrCat(
      "TYPE_", absl::AsciiStrToUpper(DeclaredTypeMethodName(key->type())));
  vars["val_wire_type"] = absl::StrCat(
      "TYPE_", absl::AsciiStrToUpper(DeclaredTypeMethodName(val->type())));
}